

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void cfd::core::SetPsbtTxInScriptAndKeyList
               (wally_psbt_input *input,bool is_witness,Script *redeem_script,
               vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list,
               Script *locking_script)

{
  bool bVar1;
  CfdException *pCVar2;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_val;
  Script local_98;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  bVar1 = Script::IsEmpty(redeem_script);
  if (!bVar1) {
    Script::GetData((ByteData *)&local_98,redeem_script);
    ByteData::GetBytes(&script_val,(ByteData *)&local_98);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98);
    if (is_witness) {
      bVar1 = Script::IsP2wpkhScript(redeem_script);
      if (!bVar1) {
        ret = wally_psbt_input_set_witness_script
                        (input,script_val.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                         (long)script_val.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)script_val.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
        if (ret != 0) {
          local_98._vptr_Script = (_func_int **)0x22e1c0;
          local_98.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0xfa;
          local_98.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = "SetPsbtTxInScriptAndKeyList";
          logger::warn<int&>((CfdSourceLocation *)&local_98,
                             "wally_psbt_input_set_witness_script NG[{}]",&ret);
          pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::__cxx11::string::string
                    ((string *)&local_98,"psbt add witness script error.",(allocator *)&local_48);
          CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&local_98);
          __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
        }
        bVar1 = Script::IsP2shScript(locking_script);
        if (bVar1) {
          ScriptUtil::CreateP2wshLockingScript(&local_98,redeem_script);
          Script::GetData((ByteData *)&local_60,&local_98);
          ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
                             (ByteData *)&local_60);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&script_val,&local_48)
          ;
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_48);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_60);
          Script::~Script(&local_98);
        }
        else if (script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish !=
                 script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start) {
          script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
      }
    }
    if (script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ret = wally_psbt_input_set_redeem_script
                      (input,script_val.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                       (long)script_val.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)script_val.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
      if (ret != 0) {
        local_98._vptr_Script = (_func_int **)0x22e1c0;
        local_98.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x10a;
        local_98.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = "SetPsbtTxInScriptAndKeyList";
        logger::warn<int&>((CfdSourceLocation *)&local_98,
                           "wally_psbt_input_set_redeem_script NG[{}]",&ret);
        pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&local_98,"psbt add redeem script error.",(allocator *)&local_48);
        CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&local_98);
        __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  if ((key_list->super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (key_list->super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    SetKeyPathMap(key_list,&input->keypaths);
    ret = wally_map_sort(&input->keypaths,0);
    if (ret != 0) {
      local_98._vptr_Script = (_func_int **)0x22e1c0;
      local_98.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x115;
      local_98.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = "SetPsbtTxInScriptAndKeyList";
      logger::warn<int&>((CfdSourceLocation *)&local_98,"wally_map_sort NG[{}]",&ret);
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&local_98,"psbt input sort keypaths error.",(allocator *)&script_val);
      CfdException::CfdException(pCVar2,kCfdInternalError,(string *)&local_98);
      __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  return;
}

Assistant:

void SetPsbtTxInScriptAndKeyList(
    struct wally_psbt_input *input, bool is_witness,
    const Script &redeem_script, const std::vector<KeyData> &key_list,
    const Script &locking_script) {
  int ret;
  if (!redeem_script.IsEmpty()) {
    auto script_val = redeem_script.GetData().GetBytes();
    if (is_witness && (!redeem_script.IsP2wpkhScript())) {
      ret = wally_psbt_input_set_witness_script(
          input, script_val.data(), script_val.size());
      if (ret != WALLY_OK) {
        warn(
            CFD_LOG_SOURCE, "wally_psbt_input_set_witness_script NG[{}]", ret);
        throw CfdException(
            kCfdIllegalArgumentError, "psbt add witness script error.");
      }
      if (locking_script.IsP2shScript()) {
        script_val = ScriptUtil::CreateP2wshLockingScript(redeem_script)
                         .GetData()
                         .GetBytes();
      } else {
        script_val.clear();
      }
    }
    if (!script_val.empty()) {
      ret = wally_psbt_input_set_redeem_script(
          input, script_val.data(), script_val.size());
      if (ret != WALLY_OK) {
        warn(CFD_LOG_SOURCE, "wally_psbt_input_set_redeem_script NG[{}]", ret);
        throw CfdException(
            kCfdIllegalArgumentError, "psbt add redeem script error.");
      }
    }
  }

  if (!key_list.empty()) {
    SetKeyPathMap(key_list, &input->keypaths);
    ret = wally_map_sort(&input->keypaths, 0);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_sort NG[{}]", ret);
      throw CfdException(kCfdInternalError, "psbt input sort keypaths error.");
    }
  }
}